

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_scaling_operations.c
# Opt level: O0

void WebRtcSpl_ScaleAndAddVectors
               (int16_t *in1,int16_t gain1,int shift1,int16_t *in2,int16_t gain2,int shift2,
               int16_t *out,size_t vector_length)

{
  short *local_48;
  int16_t *outptr;
  int16_t *in2ptr;
  int16_t *in1ptr;
  size_t i;
  int shift2_local;
  int16_t gain2_local;
  int16_t *in2_local;
  int shift1_local;
  int16_t gain1_local;
  int16_t *in1_local;
  
  local_48 = out;
  outptr = in2;
  in2ptr = in1;
  for (in1ptr = (int16_t *)0x0; in1ptr < vector_length; in1ptr = (int16_t *)((long)in1ptr + 1)) {
    *local_48 = (short)((int)gain1 * (int)*in2ptr >> ((byte)shift1 & 0x1f)) +
                (short)((int)gain2 * (int)*outptr >> ((byte)shift2 & 0x1f));
    local_48 = local_48 + 1;
    outptr = outptr + 1;
    in2ptr = in2ptr + 1;
  }
  return;
}

Assistant:

void WebRtcSpl_ScaleAndAddVectors(const int16_t *in1, int16_t gain1, int shift1,
                                  const int16_t *in2, int16_t gain2, int shift2,
                                  int16_t *out, size_t vector_length)
{
    // Performs vector operation: out = (gain1*in1)>>shift1 + (gain2*in2)>>shift2
    size_t i;
    const int16_t *in1ptr;
    const int16_t *in2ptr;
    int16_t *outptr;

    in1ptr = in1;
    in2ptr = in2;
    outptr = out;

    for (i = 0; i < vector_length; i++)
    {
      *outptr++ = (int16_t)((gain1 * *in1ptr++) >> shift1) +
          (int16_t)((gain2 * *in2ptr++) >> shift2);
    }
}